

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_io.cpp
# Opt level: O1

void ucnv_getAliases_63(char *alias,char **aliases,UErrorCode *pErrorCode)

{
  uint16_t uVar1;
  ushort uVar2;
  uint16_t *puVar3;
  uint16_t *puVar4;
  uint16_t *puVar5;
  UBool UVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  size_t sVar10;
  ulong uVar11;
  ulong uVar12;
  uint32_t uVar13;
  uint uVar14;
  bool bVar15;
  char local_78 [72];
  
  UVar6 = haveAliasData(pErrorCode);
  if (UVar6 == '\0') {
    return;
  }
  if (alias == (char *)0x0) {
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    return;
  }
  if (*alias == '\0') {
    return;
  }
  uVar1 = (gMainTable.optionTable)->stringNormalizationType;
  if (uVar1 != 0) {
    sVar10 = strlen(alias);
    if (0x3b < sVar10) {
      *pErrorCode = U_BUFFER_OVERFLOW_ERROR;
      uVar9 = 0xffffffff;
      goto LAB_002b8720;
    }
    ucnv_io_stripASCIIForCompare_63(local_78,alias);
    alias = local_78;
  }
  puVar5 = gMainTable.normalizedStringTable;
  puVar4 = gMainTable.stringTable;
  puVar3 = gMainTable.aliasList;
  uVar14 = 0;
  uVar13 = gMainTable.untaggedConvArraySize;
  uVar9 = gMainTable.untaggedConvArraySize >> 1;
  do {
    if (uVar1 == 0) {
      iVar7 = ucnv_compareNames_63(alias,(char *)(puVar4 + puVar3[uVar9]));
    }
    else {
      iVar7 = strcmp(alias,(char *)(puVar5 + puVar3[uVar9]));
    }
    uVar8 = uVar9;
    if ((-1 < iVar7) && (uVar8 = uVar13, uVar14 = uVar9, iVar7 == 0)) {
      uVar2 = gMainTable.untaggedConvArray[uVar9];
      if ((short)uVar2 < 0) {
        *pErrorCode = U_AMBIGUOUS_ALIAS_WARNING;
      }
      uVar9 = uVar2 & 0xfff;
      goto LAB_002b8720;
    }
    uVar13 = uVar8;
    uVar8 = uVar13 + uVar14 >> 1;
    bVar15 = uVar9 != uVar8;
    uVar9 = uVar8;
  } while (bVar15);
  uVar9 = 0xffffffff;
LAB_002b8720:
  puVar4 = gMainTable.stringTable;
  puVar3 = gMainTable.taggedAliasLists;
  if (((uVar9 < gMainTable.converterListSize) &&
      (uVar11 = (ulong)gMainTable.taggedAliasArray
                       [(gMainTable.tagListSize - 1) * gMainTable.converterListSize + uVar9],
      uVar11 != 0)) && (uVar2 = gMainTable.taggedAliasLists[uVar11], (ulong)uVar2 != 0)) {
    uVar12 = 0;
    do {
      aliases[uVar12] = (char *)(puVar4 + puVar3[uVar11 + uVar12 + 1]);
      uVar12 = uVar12 + 1;
    } while (uVar2 != uVar12);
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
ucnv_getAliases(const char *alias, const char **aliases, UErrorCode *pErrorCode)
{
    ucnv_io_getAliases(alias, 0, aliases, pErrorCode);
}